

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.cpp
# Opt level: O3

void __thiscall psy::TextElement::TextElement(TextElement *this,char *chars,uint size)

{
  char *__dest;
  long lVar1;
  uint uVar2;
  
  this->_vptr_TextElement = (_func_int **)&PTR__TextElement_0012d8d0;
  this->size_ = size;
  __dest = (char *)operator_new__((ulong)(size + 1));
  this->chars_ = __dest;
  this->next_ = (TextElement *)0x0;
  strncpy(__dest,chars,(ulong)size);
  __dest[size] = '\0';
  if (size == 0) {
    uVar2 = 0;
  }
  else {
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (int)__dest[lVar1] + uVar2 * 0x10;
      uVar2 = uVar2 & 0xfffffff ^ uVar2 >> 0x17 & 0xffffffe0;
      lVar1 = lVar1 + 1;
    } while (size != (uint)lVar1);
  }
  this->hashCode_ = uVar2;
  return;
}

Assistant:

TextElement::TextElement(const char* chars, unsigned int size)
    : size_(size)
    , chars_(new char[size + 1])
    , next_(nullptr)
{
    std::strncpy(chars_, chars, size);
    chars_[size] = 0;
    hashCode_ = hashCode(chars_, size_);
}